

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall brown::Tile::drawcircfill(Tile *this,int xc,int yc,int r,uint32_t col)

{
  int y;
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = r * 2;
  for (iVar1 = 0; y = (yc - r) + iVar1, y <= r + yc; iVar1 = iVar1 + 1) {
    dVar3 = (double)(iVar2 * iVar1);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    drawhlin(this,xc - (int)dVar3,(int)dVar3 + xc,y,col);
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void Tile::drawcircfill (int xc, int yc, int r, std::uint32_t col)
{
    int i, y;
    for(y=yc-r;y<=yc+r;y++)
    {
        i = (int)sqrt((double)(r*r - (yc-y)*(yc-y)));
        this->drawhlin(xc-i,xc+i,y,col);
    }
}